

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

void * cimg_library::CImgDisplay::_events_thread(void *param_1)

{
  Display *pDVar1;
  undefined8 uVar2;
  int iVar3;
  X11_info *pXVar4;
  uint i;
  ulong uVar5;
  XEvent event;
  
  pXVar4 = cimg::X11_attr();
  pDVar1 = pXVar4->display;
  pthread_setcanceltype(0,(int *)0x0);
  pthread_setcancelstate(0,(int *)0x0);
  do {
    XLockDisplay(pDVar1);
    iVar3 = XCheckTypedEvent(pDVar1,0x21,&event);
    if (iVar3 == 0) {
      iVar3 = XCheckMaskEvent(pDVar1,0x2807f,&event);
      if (iVar3 != 0) goto LAB_00126e4e;
    }
    else {
LAB_00126e4e:
      uVar5 = 0;
      while( true ) {
        pXVar4 = cimg::X11_attr();
        if (pXVar4->nb_wins <= uVar5) break;
        pXVar4 = cimg::X11_attr();
        uVar2 = event.xany.window;
        if (pXVar4->wins[uVar5]->_is_closed == false) {
          pXVar4 = cimg::X11_attr();
          if (uVar2 == pXVar4->wins[uVar5]->_window) {
            pXVar4 = cimg::X11_attr();
            _handle_events(pXVar4->wins[uVar5],&event);
          }
        }
        uVar5 = uVar5 + 1;
      }
    }
    XUnlockDisplay(pDVar1);
    pthread_testcancel();
    cimg::sleep(8);
  } while( true );
}

Assistant:

static void* _events_thread(void *) { // Only one thread to handle events for all opened display windows.
      Display *const dpy = cimg::X11_attr().display;
      XEvent event;
      pthread_setcanceltype(PTHREAD_CANCEL_DEFERRED,0);
      pthread_setcancelstate(PTHREAD_CANCEL_ENABLE,0);
      for (;;) {
        XLockDisplay(dpy);
        bool event_flag = XCheckTypedEvent(dpy,ClientMessage,&event);
        if (!event_flag) event_flag = XCheckMaskEvent(dpy,
                                                      ExposureMask | StructureNotifyMask | ButtonPressMask|
                                                      KeyPressMask | PointerMotionMask | EnterWindowMask | LeaveWindowMask|
                                                      ButtonReleaseMask | KeyReleaseMask,&event);
        if (event_flag)
          for (unsigned int i = 0; i<cimg::X11_attr().nb_wins; ++i)
            if (!cimg::X11_attr().wins[i]->_is_closed && event.xany.window==cimg::X11_attr().wins[i]->_window)
              cimg::X11_attr().wins[i]->_handle_events(&event);
        XUnlockDisplay(dpy);
        pthread_testcancel();
        cimg::sleep(8);
      }
      return 0;
    }